

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark_magic.h
# Opt level: O0

void cplus::memory::copy<cplus::memory::Test>(Test *a,Test *b)

{
  long local_30;
  size_t loopTIme;
  char *swapB;
  char *swapA;
  Test *b_local;
  Test *a_local;
  
  loopTIme = (size_t)b;
  swapB = (char *)a;
  for (local_30 = 0x28; local_30 != 0; local_30 = local_30 + -1) {
    *(char *)loopTIme = *swapB;
    swapB = swapB + 1;
    loopTIme = loopTIme + 1;
  }
  return;
}

Assistant:

void copy(const T &a, const T &b) {
			char *swapA = (char *) &a;
			char *swapB = (char *) &b;
			for (size_t loopTIme = sizeof(a); loopTIme > 0; loopTIme--) {
				(*swapB) = (*swapA);
				++swapA;
				++swapB;
			}
		}